

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O2

string * int2str_abi_cxx11_(string *__return_storage_ptr__,U8 i)

{
  undefined7 in_register_00000031;
  allocator local_19;
  char number_str [8];
  
  AnalyzerHelpers::GetNumberString
            (CONCAT71(in_register_00000031,i) & 0xffffffff,Decimal,8,number_str,8);
  std::__cxx11::string::string((string *)__return_storage_ptr__,number_str,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string int2str( const U8 i )
{
    char number_str[ 8 ];
    AnalyzerHelpers::GetNumberString( i, Decimal, 8, number_str, sizeof( number_str ) );
    return number_str;
}